

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2a21b2d::HighBDConvolveHorizRSTest_Correctness_Test::TestBody
          (HighBDConvolveHorizRSTest_Correctness_Test *this)

{
  bool bVar1;
  undefined8 *puVar2;
  ConvolveHorizRSTestBase<unsigned_short> *pCVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  TestImage<unsigned_short> *pTVar8;
  long lVar9;
  long lVar10;
  pointer puVar11;
  SEARCH_METHODS *pSVar12;
  pointer puVar13;
  int iVar14;
  void **val2;
  AssertionResult gtest_ar;
  ACMRandom rnd;
  int32_t tst_value;
  int32_t ref_value;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  int local_84;
  AssertHelper local_80;
  internal local_78 [8];
  undefined8 *local_70;
  long local_68;
  int local_60;
  ACMRandom local_5c;
  uint local_58;
  uint local_54;
  TestImage<unsigned_short> **local_50;
  ConvolveHorizRSTestBase<unsigned_short> *local_48;
  ulong local_40;
  long local_38;
  
  local_5c.random_.state_ = (Random)0xbaba;
  local_50 = &(this->super_HighBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_short>.
              image_;
  local_40 = 0;
  local_48 = (ConvolveHorizRSTestBase<unsigned_short> *)this;
  do {
    val2 = (void **)0x9;
    do {
      uVar4 = testing::internal::Random::Generate(&local_5c.random_,0x80000000);
      local_84 = (uVar4 >> 0x17 & 0xff) + 0x200;
      uVar4 = testing::internal::Random::Generate(&local_5c.random_,0x80000000);
      uVar5 = testing::internal::Random::Generate(&local_5c.random_,0x80000000);
      pTVar8 = (TestImage<unsigned_short> *)operator_new(0x50);
      iVar14 = (int)val2;
      TestImage<unsigned_short>::TestImage
                (pTVar8,(uVar4 >> 0x17 & 0xff) + 0x80,local_84,iVar14,uVar5 >> 0xf & 0x3fff,
                 local_48->bd_);
      *local_50 = pTVar8;
      local_90._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      CmpHelperNE<(anonymous_namespace)::TestImage<unsigned_short>*,decltype(nullptr)>
                ((char *)local_78,(char *)local_50,(TestImage<unsigned_short> **)&local_90,val2);
      puVar2 = local_70;
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        if (local_70 == (undefined8 *)0x0) {
          pSVar12 = "";
        }
        else {
          pSVar12 = (SEARCH_METHODS *)*local_70;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                   ,0xcd,(char *)pSVar12);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_90._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_90._M_head_impl + 8))();
        }
        if (local_70 == (undefined8 *)0x0) {
          return;
        }
        if ((undefined8 *)*local_70 != local_70 + 2) {
          operator_delete((undefined8 *)*local_70);
        }
        operator_delete(local_70);
        return;
      }
      local_60 = iVar14;
      if (local_70 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_70 != local_70 + 2) {
          operator_delete((undefined8 *)*local_70);
        }
        operator_delete(puVar2);
      }
      pCVar3 = local_48;
      ConvolveHorizRSTestBase<unsigned_short>::Prep(local_48,&local_5c);
      (*(pCVar3->super_Test)._vptr_Test[6])(pCVar3,1);
      (*(pCVar3->super_Test)._vptr_Test[6])(pCVar3,0);
      pTVar8 = pCVar3->image_;
      iVar14 = pTVar8->h_;
      lVar9 = (long)pTVar8->dst_stride_;
      puVar13 = (pTVar8->dst_data_).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar10 = (long)(pTVar8->dst_stride_ * (iVar14 + 0x40));
      iVar6 = bcmp(puVar13,puVar13 + lVar10,lVar10 * 2);
      if (0 < iVar14 && iVar6 != 0) {
        puVar11 = puVar13 + lVar10 + lVar9 * 0x20 + 0x20;
        local_38 = lVar9 * 2;
        puVar13 = puVar13 + lVar9 * 0x20 + 0x20;
        local_68 = 0x20;
        do {
          if (0 < pTVar8->w_dst_) {
            local_84 = (int)local_68 + -0x20;
            lVar9 = 0;
            do {
              local_54 = (uint)puVar13[lVar9];
              local_58 = (uint)puVar11[lVar9];
              testing::internal::CmpHelperEQ<int,int>
                        (local_78,"tst_value","ref_value",(int *)&local_58,(int *)&local_54);
              if (local_78[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_90);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),"Error at row: ",0xe);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,local_84);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),", col: ",7);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,(int)lVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),", superres_denom: ",0x12);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,pTVar8->superres_denom_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),", height: ",10);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,pTVar8->h_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),", src_width: ",0xd);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,pTVar8->w_src_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),", dst_width: ",0xd);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,pTVar8->w_dst_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_90._M_head_impl + 0x10),", x0: ",6);
                std::ostream::operator<<(local_90._M_head_impl + 0x10,pTVar8->x0_);
                pSVar12 = "";
                if (local_70 != (undefined8 *)0x0) {
                  pSVar12 = (SEARCH_METHODS *)*local_70;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                           ,0xa2,(char *)pSVar12);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_90._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_90._M_head_impl + 8))();
                }
              }
              puVar2 = local_70;
              if (local_70 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_70 != local_70 + 2) {
                  operator_delete((undefined8 *)*local_70);
                }
                operator_delete(puVar2);
              }
              lVar10 = lVar9 + 0x20;
              lVar9 = lVar9 + 1;
            } while (lVar10 < (long)pTVar8->w_dst_ + 0x1f);
          }
          lVar9 = local_68 + 1;
          puVar11 = (pointer)((long)puVar11 + local_38);
          puVar13 = (pointer)((long)puVar13 + local_38);
          bVar1 = local_68 < (long)pTVar8->h_ + 0x1f;
          local_68 = lVar9;
        } while (bVar1);
      }
      pTVar8 = *local_50;
      if (pTVar8 != (TestImage<unsigned_short> *)0x0) {
        puVar13 = (pTVar8->dst_data_).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puVar13 != (pointer)0x0) {
          operator_delete(puVar13);
        }
        puVar13 = (pTVar8->src_data_).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puVar13 != (pointer)0x0) {
          operator_delete(puVar13);
        }
        operator_delete(pTVar8);
      }
      val2 = (void **)(ulong)(local_60 + 1U);
    } while (local_60 + 1U != 0x11);
    uVar7 = (int)local_40 + 1;
    local_40 = (ulong)uVar7;
    if (uVar7 == 10) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(HighBDConvolveHorizRSTest, Correctness) { CorrectnessTest(); }